

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniFlagNumbers_Test::~TApp_IniFlagNumbers_Test(TApp_IniFlagNumbers_Test *this)

{
  TApp_IniFlagNumbers_Test *this_local;
  
  ~TApp_IniFlagNumbers_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniFlagNumbers) {

    TempFile tmpini{"TestIniTmp.ini"};

    bool boo;
    app.add_flag("--flag", boo);
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "flag=3" << std::endl;
    }

    EXPECT_NO_THROW(run());
    EXPECT_TRUE(boo);
}